

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O3

void mod2sparse_copyrows(mod2sparse *m,mod2sparse *r,int *rows)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long extraout_RDX;
  uint uVar5;
  FILE *r_00;
  FILE *pFVar6;
  FILE *pFVar7;
  FILE *__stream;
  ulong uVar8;
  long lVar9;
  mod2entry *pmVar10;
  ulong uStack_88;
  
  r_00 = (FILE *)r;
  pFVar7 = (FILE *)m;
  if (m->n_cols <= r->n_cols) {
    pFVar7 = (FILE *)r;
    mod2sparse_clear(r);
    iVar4 = r->n_rows;
    if (0 < iVar4) {
      uVar8 = 0;
      do {
        iVar1 = rows[uVar8];
        if (((long)iVar1 < 0) || (m->n_rows <= iVar1)) {
          mod2sparse_copyrows_cold_1();
          goto LAB_001216fc;
        }
        pmVar10 = m->rows[iVar1].right;
        if (-1 < pmVar10->row) {
          do {
            r_00 = (FILE *)(uVar8 & 0xffffffff);
            pFVar7 = (FILE *)r;
            mod2sparse_insert(r,(int)uVar8,pmVar10->col);
            pmVar10 = pmVar10->right;
          } while (-1 < pmVar10->row);
          iVar4 = r->n_rows;
        }
        uVar8 = uVar8 + 1;
      } while ((long)uVar8 < (long)iVar4);
    }
    return;
  }
LAB_001216fc:
  mod2sparse_copyrows_cold_2();
  pFVar6 = r_00;
  __stream = pFVar7;
  if (pFVar7->_flags <= r_00->_flags) {
    __stream = r_00;
    mod2sparse_clear((mod2sparse *)r_00);
    iVar4 = *(int *)&r_00->field_0x4;
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        iVar1 = *(int *)(extraout_RDX + lVar9 * 4);
        if (((long)iVar1 < 0) || (*(int *)&pFVar7->field_0x4 <= iVar1)) {
          mod2sparse_copycols_cold_1();
          goto LAB_00121785;
        }
        pmVar10 = ((mod2entry *)pFVar7->_IO_read_end)[iVar1].down;
        pFVar6 = (FILE *)(ulong)(uint)pmVar10->row;
        if (-1 < pmVar10->row) {
          do {
            __stream = r_00;
            mod2sparse_insert((mod2sparse *)r_00,(int)pFVar6,(int)lVar9);
            pmVar10 = pmVar10->down;
            pFVar6 = (FILE *)(ulong)(uint)pmVar10->row;
          } while (-1 < pmVar10->row);
          iVar4 = *(int *)&r_00->field_0x4;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
    }
    return;
  }
LAB_00121785:
  mod2sparse_copycols_cold_2();
  uVar2 = pFVar6->_flags;
  uVar5 = 1;
  uStack_88 = 0x100000000;
  if ((((10 < (int)uVar2) && (uStack_88 = 0x200000000, 100 < uVar2)) &&
      (uStack_88 = 0x300000000, 1000 < uVar2)) && (uStack_88 = 0x400000000, 10000 < uVar2)) {
    uStack_88 = (ulong)(6 - (uVar2 < 0x186a1)) << 0x20;
  }
  uVar3 = *(uint *)&pFVar6->field_0x4;
  if (((10 < (int)uVar3) && (uVar5 = 2, 100 < uVar3)) &&
     ((uVar5 = 3, 1000 < uVar3 && (uVar5 = 4, 10000 < uVar3)))) {
    uVar5 = 6 - (uVar3 < 0x186a1);
  }
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      fprintf(__stream,"%*d:",uStack_88 >> 0x20,uVar8 & 0xffffffff);
      for (pmVar10 = ((mod2entry *)pFVar6->_IO_read_ptr)[uVar8].right; -1 < pmVar10->row;
          pmVar10 = pmVar10->right) {
        fprintf(__stream," %*d",(ulong)uVar5,(ulong)(uint)pmVar10->col);
      }
      fputc(10,__stream);
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)pFVar6->_flags);
  }
  return;
}

Assistant:

void mod2sparse_copyrows
( mod2sparse *m,	/* Matrix to copy */
  mod2sparse *r,	/* Place to store copy of matrix */
  int *rows		/* Indexes of rows to copy, from 0 */
)
{ 
  mod2entry *e;
  int i;

  if (mod2sparse_cols(m)>mod2sparse_cols(r))
  { fprintf(stderr,
     "mod2sparse_copyrows: Destination matrix has fewer columns than source\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(r); i++)
  { if (rows[i]<0 || rows[i]>=mod2sparse_rows(m))
    { fprintf(stderr,"mod2sparse_copyrows: Row index out of range\n");
      exit(1);
    }
    e = mod2sparse_first_in_row(m,rows[i]);
    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,i,e->col);
      e = mod2sparse_next_in_row(e);
    }
  }
}